

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::ParsedFormatBase::ParsedFormatConsumer::ConvertOne
          (ParsedFormatConsumer *this,UnboundConversion *conv,string_view s)

{
  value_type local_60;
  ParsedFormatConsumer *local_40;
  char *local_38;
  size_t local_30;
  size_t text_end;
  UnboundConversion *conv_local;
  ParsedFormatConsumer *this_local;
  string_view s_local;
  
  local_38 = s._M_str;
  local_40 = (ParsedFormatConsumer *)s._M_len;
  text_end = (size_t)conv;
  conv_local = (UnboundConversion *)this;
  this_local = local_40;
  s_local._M_len = (size_t)local_38;
  local_60.text_end = AppendText(this,s);
  local_60.is_conversion = true;
  local_60.conv._0_8_ = *(undefined8 *)text_end;
  local_60.conv.precision.value_ = *(int *)(text_end + 8);
  local_60.conv._12_2_ = *(undefined2 *)(text_end + 0xc);
  local_60.conv.conv = *(FormatConversionChar *)(text_end + 0xe);
  local_30 = local_60.text_end;
  std::
  vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
  ::push_back(&this->parsed->items_,&local_60);
  return true;
}

Assistant:

bool ConvertOne(const UnboundConversion &conv, string_view s) {
    size_t text_end = AppendText(s);
    parsed->items_.push_back({true, text_end, conv});
    return true;
  }